

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  size_t sVar1;
  char *__nptr;
  long *plVar2;
  int iVar3;
  char *val;
  undefined7 in_register_00000011;
  bool bVar4;
  long *local_48;
  size_t local_40;
  long local_38 [2];
  
  if ((int)CONCAT71(in_register_00000011,one) == 0) {
    val = GetDefinitionIfUnquoted(this,arg);
    if (val == (char *)0x0) {
      __nptr = (arg->Value)._M_dataplus._M_p;
      iVar3 = atoi(__nptr);
      val = (char *)0x0;
      if (iVar3 != 0) {
        val = __nptr;
      }
    }
  }
  else {
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
    plVar2 = local_48;
    sVar1 = (arg->Value)._M_string_length;
    if (sVar1 == local_40) {
      if (sVar1 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp((arg->Value)._M_dataplus._M_p,local_48,sVar1);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (plVar2 != local_38) {
      operator_delete(plVar2,local_38[0] + 1);
    }
    if (bVar4) {
      return false;
    }
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1","");
    plVar2 = local_48;
    sVar1 = (arg->Value)._M_string_length;
    if (sVar1 == local_40) {
      if (sVar1 == 0) {
        bVar4 = true;
      }
      else {
        iVar3 = bcmp((arg->Value)._M_dataplus._M_p,local_48,sVar1);
        bVar4 = iVar3 == 0;
      }
    }
    else {
      bVar4 = false;
    }
    if (plVar2 != local_38) {
      operator_delete(plVar2,local_38[0] + 1);
    }
    if (bVar4) {
      return true;
    }
    val = GetDefinitionIfUnquoted(this,arg);
  }
  bVar4 = cmSystemTools::IsOff(val);
  return !bVar4;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if(one)
    {
    // Old IsTrue behavior for single argument.
    if(arg == "0")
      { return false; }
    else if(arg == "1")
      { return true; }
    else
      {
      const char* def = this->GetDefinitionIfUnquoted(arg);
      return !cmSystemTools::IsOff(def);
      }
    }
  else
    {
    // Old GetVariableOrNumber behavior.
    const char* def = this->GetDefinitionIfUnquoted(arg);
    if(!def && atoi(arg.c_str()))
      {
      def = arg.c_str();
      }
    return !cmSystemTools::IsOff(def);
    }
}